

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

int lj_cf_table_insert(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  uint64_t uVar2;
  MSize key;
  int iVar3;
  uint key_00;
  uint uVar4;
  GCtab *t;
  TValue *pTVar5;
  TValue TVar6;
  TValue *pTVar7;
  long lVar8;
  long lVar9;
  GCobj *o;
  
  t = lj_lib_checktab(L,1);
  key = lj_tab_len(t);
  iVar3 = *(int *)&L->top - *(int *)&L->base;
  key_00 = key + 1;
  if (iVar3 != 0x10) {
    if (iVar3 != 0x18) {
      lj_err_caller(L,LJ_ERR_TABINS);
    }
    key_00 = lj_lib_checkint(L,2);
    if ((int)key_00 <= (int)key) {
      lVar9 = (long)(int)(key + 1);
      lVar8 = lVar9 * 8;
      do {
        uVar4 = t->asize;
        if (key + 1 < uVar4) {
          pTVar7 = (TValue *)((t->array).ptr64 + lVar8);
        }
        else {
          pTVar7 = lj_tab_setinth(L,t,key + 1);
          uVar4 = t->asize;
        }
        if (key < uVar4) {
          pTVar5 = (TValue *)((t->array).ptr64 + lVar8 + -8);
        }
        else {
          pTVar5 = lj_tab_getinth(t,key);
        }
        if (pTVar5 == (TValue *)0x0) {
          TVar6.u64 = 0xffffffffffffffff;
        }
        else {
          TVar6 = *pTVar5;
        }
        lVar9 = lVar9 + -1;
        *pTVar7 = TVar6;
        key = key - 1;
        lVar8 = lVar8 + -8;
      } while ((int)key_00 < lVar9);
    }
  }
  if (key_00 < t->asize) {
    pTVar7 = (TValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
  }
  else {
    pTVar7 = lj_tab_setinth(L,t,key_00);
  }
  aVar1 = L->top[-1].field_4;
  pTVar7->field_4 = aVar1;
  if (((((int)aVar1.it >> 0xf) + 0xdU < 9) &&
      ((*(byte *)(((ulong)aVar1 & 0x7fffffffffff) + 8) & 3) != 0)) && ((t->marked & 4) != 0)) {
    uVar2 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar2 + 0x40);
    *(GCtab **)(uVar2 + 0x40) = t;
  }
  return 0;
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}